

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall Parser::checkExpFuncDefinition(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TokenizerPosition start;
  iterator this_00;
  pointer pFVar2;
  pointer pCVar3;
  bool bVar4;
  int iVar5;
  Token *token;
  Token *pTVar6;
  ExpressionFunctionHandler *pEVar7;
  char *pcVar8;
  optional<ExpressionFunctionHandle> oVar9;
  Identifier functionName;
  vector<Identifier,_std::allocator<Identifier>_> functionParameters;
  vector<Token,_std::allocator<Token>_> functionContent;
  Identifier local_78;
  vector<Identifier,_std::allocator<Identifier>_> local_58;
  vector<Token,_std::allocator<Token>_> local_40;
  
  token = Tokenizer::peekToken
                    ((this->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (token->type != Identifier) {
    return false;
  }
  if (*(__index_type *)
       ((long)&(token->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) != '\x04') {
    __assert_fail("std::holds_alternative<Identifier>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                  ,0x4d,"const Identifier &Token::identifierValue() const");
  }
  pcVar8 = *(char **)&(token->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
  if (((*pcVar8 != '.') ||
      (*(long *)((long)&(token->value).
                        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        .
                        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                + 8) != 8)) || (iVar5 = bcmp(pcVar8,".expfunc",8), iVar5 != 0)) {
    return false;
  }
  Tokenizer::eatTokens
            ((this->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  paVar1 = &local_78._name.field_2;
  local_78._name._M_string_length = 0;
  local_78._name.field_2._M_local_buf[0] = '\0';
  local_58.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._name._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = parseFunctionDeclaration(this,&local_78,&local_58);
  if ((!bVar4) ||
     (pTVar6 = Tokenizer::nextToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
     pTVar6->type != Comma)) {
    printError<>(this,token,"Invalid expression function declaration");
    bVar4 = false;
    goto LAB_00146b3d;
  }
  start.it._M_node =
       (iterator)
       (((this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
  while ((this_00._M_node =
               (_List_node_base *)
               (this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer,
         (_List_node_base *)((TokenizerPosition *)((long)(this_00._M_node + 1) + 8))->it !=
         this_00._M_node &&
         (pTVar6 = Tokenizer::peekToken((Tokenizer *)this_00._M_node,0), pTVar6->type != Separator))
        ) {
    Tokenizer::eatTokens
              ((this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer,1);
  }
  pFVar2 = (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  Tokenizer::getTokens
            (&local_40,pFVar2[-1].tokenizer,start,
             (TokenizerPosition)((pFVar2[-1].tokenizer)->position).it._M_node);
  pCVar3 = (this->conditionStack).
           super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar3[-1].inUnknownBlock == false) {
    bVar4 = true;
    if (pCVar3[-1].inTrueBlock == true) {
      pTVar6 = Tokenizer::nextToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      if (pTVar6->type != Separator) {
        pcVar8 = ".expfunc directive not terminated";
        goto LAB_00146ab9;
      }
      pEVar7 = ExpressionFunctionHandler::instance();
      oVar9 = ExpressionFunctionHandler::find(pEVar7,&local_78);
      if (((undefined1  [16])
           oVar9.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
           super__Optional_payload_base<ExpressionFunctionHandle> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        pEVar7 = ExpressionFunctionHandler::instance();
        ExpressionFunctionHandler::addUserFunction(pEVar7,&local_78,&local_58,&local_40);
        goto LAB_00146b33;
      }
      printError<Identifier>(this,token,"Expression function \"%s\" already declared",&local_78);
      goto LAB_00146ac4;
    }
  }
  else {
    pcVar8 = "Expression function definition not allowed inside of block with non-trivial condition"
    ;
LAB_00146ab9:
    printError<>(this,token,pcVar8);
LAB_00146ac4:
    bVar4 = false;
  }
LAB_00146b33:
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_40);
LAB_00146b3d:
  std::vector<Identifier,_std::allocator<Identifier>_>::~vector(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._name._M_dataplus._M_p == paVar1) {
    return bVar4;
  }
  operator_delete(local_78._name._M_dataplus._M_p,
                  CONCAT71(local_78._name.field_2._M_allocated_capacity._1_7_,
                           local_78._name.field_2._M_local_buf[0]) + 1);
  return bVar4;
}

Assistant:

bool Parser::checkExpFuncDefinition()
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	const auto &identifier = first.identifierValue();
	if (!identifier.startsWith('.') || first.identifierValue() != ".expfunc")
		return false;

	eatToken();

	Identifier functionName;
	std::vector<Identifier> functionParameters;

	// load declarationn
	if (!parseFunctionDeclaration(functionName, functionParameters))
	{
		printError(first, "Invalid expression function declaration");
		return false;
	}

	if (nextToken().type != TokenType::Comma)
	{
		printError(first, "Invalid expression function declaration");
		return false;
	}

	// load definition
	TokenizerPosition start = getTokenizer()->getPosition();

	while (!atEnd() && peekToken().type != TokenType::Separator)
		eatToken();

	TokenizerPosition end = getTokenizer()->getPosition();
	auto functionContent = getTokenizer()->getTokens(start,end);

	// checks

	// Expression functions have to be defined at parse time, so they can't be defined in blocks
	// with non-trivial conditions
	if (isInsideUnknownBlock())
	{
		printError(first, "Expression function definition not allowed inside of block with non-trivial condition");
		return false;
	}

	// if we are in a known false block, don't define the function
	if (!isInsideTrueBlock())
		return true;

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, ".expfunc directive not terminated");
		return false;
	}

	// duplicate check
	if (ExpressionFunctionHandler::instance().find(functionName))
	{
		printError(first, "Expression function \"%s\" already declared", functionName);
		return false;
	}

	// register function
	ExpressionFunctionHandler::instance().addUserFunction(functionName, functionParameters, functionContent);
	return true;
}